

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O3

void __thiscall Reducer::reduceUsingPasses(Reducer *this)

{
  pointer pcVar1;
  undefined4 uVar2;
  bool bVar3;
  long *plVar4;
  ostream *poVar5;
  ulong uVar6;
  size_type *psVar7;
  long *plVar8;
  undefined8 uVar9;
  long lVar10;
  undefined1 auVar11 [8];
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  undefined1 local_688 [24];
  undefined1 auStack_670 [24];
  undefined1 local_658 [16];
  undefined1 *local_648 [2];
  undefined1 local_638 [16];
  undefined1 *local_628 [2];
  undefined1 local_618 [16];
  undefined1 *local_608 [2];
  undefined1 local_5f8 [16];
  undefined1 *local_5e8 [2];
  undefined1 local_5d8 [16];
  undefined1 *local_5c8 [2];
  undefined1 local_5b8 [16];
  undefined1 *local_5a8 [2];
  undefined1 local_598 [16];
  undefined1 *local_588 [2];
  undefined1 local_578 [16];
  undefined1 *local_568 [2];
  undefined1 local_558 [16];
  undefined1 *local_548 [2];
  undefined1 local_538 [16];
  undefined1 *local_528 [2];
  undefined1 local_518 [16];
  undefined1 *local_508 [2];
  undefined1 local_4f8 [16];
  undefined1 *local_4e8 [2];
  undefined1 local_4d8 [16];
  undefined1 *local_4c8 [2];
  undefined1 local_4b8 [16];
  undefined1 *local_4a8 [2];
  undefined1 local_498 [16];
  undefined1 *local_488 [2];
  undefined1 local_478 [16];
  undefined1 *local_468 [2];
  undefined1 local_458 [16];
  undefined1 *local_448 [2];
  undefined1 local_438 [16];
  undefined1 *local_428 [2];
  undefined1 local_418 [16];
  undefined1 *local_408 [2];
  undefined1 local_3f8 [16];
  undefined1 *local_3e8 [2];
  undefined1 local_3d8 [16];
  undefined1 *local_3c8 [2];
  undefined1 local_3b8 [16];
  undefined1 *local_3a8 [2];
  undefined1 local_398 [16];
  undefined1 *local_388 [2];
  undefined1 local_378 [16];
  undefined1 *local_368 [2];
  undefined1 local_358 [16];
  undefined1 *local_348 [2];
  undefined1 local_338 [16];
  undefined1 *local_328 [2];
  undefined1 local_318 [16];
  undefined1 *local_308 [2];
  undefined1 local_2f8 [16];
  undefined1 *local_2e8 [2];
  undefined1 local_2d8 [16];
  undefined1 *local_2c8 [2];
  undefined1 local_2b8 [16];
  undefined1 *local_2a8 [2];
  undefined1 local_298 [16];
  undefined1 *local_288 [2];
  undefined1 local_278 [16];
  undefined1 *local_268 [2];
  undefined1 local_258 [16];
  undefined1 *local_248 [2];
  undefined1 local_238 [16];
  undefined1 *local_228 [2];
  undefined1 local_218 [16];
  undefined1 *local_208 [2];
  undefined1 local_1f8 [16];
  long *local_1e8 [2];
  long local_1d8 [2];
  undefined1 local_1c8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  passes;
  undefined1 local_1a0 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  string local_168;
  long *local_148 [2];
  long local_138 [2];
  size_type *local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> pass;
  long local_f8;
  long lStack_f0;
  long *local_e8;
  long local_e0;
  long local_d8;
  long lStack_d0;
  long *local_c8;
  long local_c0;
  long local_b8;
  long lStack_b0;
  size_type *local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  size_type *local_80;
  string currCommand;
  long *local_58;
  long local_50;
  long local_48;
  long lStack_40;
  uint local_34;
  
  local_688._0_8_ = local_688 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_688,"-Oz","");
  auStack_670._8_8_ = local_658;
  std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_670 + 8),"-Os","");
  local_648[0] = local_638;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_648,"-O1","");
  local_628[0] = local_618;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_628,"-O2","");
  local_608[0] = local_5f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_608,"-O3","");
  local_5e8[0] = local_5d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5e8,"-O4","");
  local_5c8[0] = local_5b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5c8,"--flatten -Os","");
  local_5a8[0] = local_598;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5a8,"--flatten -O3","");
  local_588[0] = local_578;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_588,"--flatten --simplify-locals-notee-nostructure --local-cse -Os","")
  ;
  local_568[0] = local_558;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_568,"--type-ssa -Os --type-merging","");
  local_548[0] = local_538;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_548,"--gufa -O1","");
  local_528[0] = local_518;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_528,"--coalesce-locals --vacuum","");
  local_508[0] = local_4f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_508,"--dae","");
  local_4e8[0] = local_4d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,"--dae-optimizing","");
  local_4c8[0] = local_4b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4c8,"--dce","");
  local_4a8[0] = local_498;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4a8,"--duplicate-function-elimination","");
  local_488[0] = local_478;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_488,"--enclose-world","");
  local_468[0] = local_458;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_468,"--gto","");
  local_448[0] = local_438;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_448,"--inlining","");
  local_428[0] = local_418;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"--inlining-optimizing","");
  local_408[0] = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_408,"--optimize-level=3 --inlining-optimizing","");
  local_3e8[0] = local_3d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,"--local-cse","");
  local_3c8[0] = local_3b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"--memory-packing","");
  local_3a8[0] = local_398;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3a8,"--remove-unused-names --merge-blocks --vacuum","");
  local_388[0] = local_378;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_388,"--optimize-instructions","");
  local_368[0] = local_358;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"--precompute","");
  local_348[0] = local_338;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_348,"--remove-imports","");
  local_328[0] = local_318;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_328,"--remove-memory-init","");
  local_308[0] = local_2f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_308,"--remove-unused-names --remove-unused-brs","");
  local_2e8[0] = local_2d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2e8,"--remove-unused-module-elements","");
  local_2c8[0] = local_2b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2c8,"--remove-unused-nonfunction-module-elements","");
  local_2a8[0] = local_298;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"--reorder-functions","");
  local_288[0] = local_278;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"--reorder-locals","");
  local_268[0] = local_258;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"--simplify-globals","");
  local_248[0] = local_238;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_248,"--simplify-locals --vacuum","");
  local_228[0] = local_218;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"--strip","");
  local_208[0] = local_1f8;
  currCommand.field_2._8_8_ = this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_208,"--remove-unused-types --closed-world","");
  plVar4 = local_1d8;
  local_1e8[0] = plVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"--vacuum","");
  __l._M_len = 0x26;
  __l._M_array = (iterator)local_688;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_1c8,__l,(allocator_type *)&local_128);
  lVar10 = -0x4c0;
  do {
    if (plVar4 != (long *)plVar4[-2]) {
      operator_delete((long *)plVar4[-2],*plVar4 + 1);
    }
    uVar9 = currCommand.field_2._8_8_;
    plVar4 = plVar4 + -4;
    lVar10 = lVar10 + 0x20;
  } while (lVar10 != 0);
  passes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_1a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)
             &passes.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             *(long *)(currCommand.field_2._8_8_ + 0x170),
             *(long *)(currCommand.field_2._8_8_ + 0x178) +
             *(long *)(currCommand.field_2._8_8_ + 0x170));
  __str.field_2._8_8_ =
       wasm::file_size(&passes.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (passes.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)local_1a0) {
    operator_delete(passes.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)(local_1a0._0_8_ + 1))
    ;
  }
  do {
    local_1a0._16_8_ =
         passes.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    if (local_1c8 ==
        (undefined1  [8])
        passes.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) break;
    local_34 = 0;
    auVar11 = local_1c8;
    do {
      local_128 = &pass._M_string_length;
      pcVar1 = (((pointer)auVar11)->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_128,pcVar1,pcVar1 + ((pointer)auVar11)->_M_string_length);
      local_58 = &local_48;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"wasm-opt","");
      wasm::Path::getBinaryenBinaryTool((string *)local_688);
      plVar4 = (long *)std::__cxx11::string::append((char *)local_688);
      local_80 = &currCommand._M_string_length;
      psVar7 = (size_type *)(plVar4 + 2);
      if ((size_type *)*plVar4 == psVar7) {
        currCommand._M_string_length = *psVar7;
        currCommand.field_2._M_allocated_capacity = plVar4[3];
      }
      else {
        currCommand._M_string_length = *psVar7;
        local_80 = (size_type *)*plVar4;
      }
      currCommand._M_dataplus._M_p = (pointer)plVar4[1];
      *plVar4 = (long)psVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      if ((undefined1 *)local_688._0_8_ != local_688 + 0x10) {
        operator_delete((void *)local_688._0_8_,local_688._16_8_ + 1);
      }
      if (local_58 != &local_48) {
        operator_delete(local_58,local_48 + 1);
      }
      local_a8 = &__str._M_string_length;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a8,*(long *)(uVar9 + 0x170),
                 *(long *)(uVar9 + 0x178) + *(long *)(uVar9 + 0x170));
      std::__cxx11::string::append((char *)&local_a8);
      plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_a8,*(ulong *)(uVar9 + 0x150));
      local_c8 = &local_b8;
      plVar8 = plVar4 + 2;
      if ((long *)*plVar4 == plVar8) {
        local_b8 = *plVar8;
        lStack_b0 = plVar4[3];
      }
      else {
        local_b8 = *plVar8;
        local_c8 = (long *)*plVar4;
      }
      local_c0 = plVar4[1];
      *plVar4 = (long)plVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_c8);
      local_e8 = &local_d8;
      plVar8 = plVar4 + 2;
      if ((long *)*plVar4 == plVar8) {
        local_d8 = *plVar8;
        lStack_d0 = plVar4[3];
      }
      else {
        local_d8 = *plVar8;
        local_e8 = (long *)*plVar4;
      }
      local_e0 = plVar4[1];
      *plVar4 = (long)plVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_128);
      pass.field_2._8_8_ = &local_f8;
      plVar8 = plVar4 + 2;
      if ((long *)*plVar4 == plVar8) {
        local_f8 = *plVar8;
        lStack_f0 = plVar4[3];
      }
      else {
        local_f8 = *plVar8;
        pass.field_2._8_8_ = (long *)*plVar4;
      }
      *plVar4 = (long)plVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append(pass.field_2._M_local_buf + 8);
      local_58 = &local_48;
      plVar8 = plVar4 + 2;
      if ((long *)*plVar4 == plVar8) {
        local_48 = *plVar8;
        lStack_40 = plVar4[3];
      }
      else {
        local_48 = *plVar8;
        local_58 = (long *)*plVar4;
      }
      local_50 = plVar4[1];
      *plVar4 = (long)plVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_58,(ulong)extraFlags_abi_cxx11_._M_dataplus._M_p);
      local_688._0_8_ = local_688 + 0x10;
      psVar7 = (size_type *)(plVar4 + 2);
      if ((size_type *)*plVar4 == psVar7) {
        local_688._16_8_ = *psVar7;
        auStack_670._0_8_ = plVar4[3];
      }
      else {
        local_688._16_8_ = *psVar7;
        local_688._0_8_ = (size_type *)*plVar4;
      }
      local_688._8_8_ = plVar4[1];
      *plVar4 = (long)psVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_80,local_688._0_8_);
      if ((undefined1 *)local_688._0_8_ != local_688 + 0x10) {
        operator_delete((void *)local_688._0_8_,local_688._16_8_ + 1);
      }
      if (local_58 != &local_48) {
        operator_delete(local_58,local_48 + 1);
      }
      if ((long *)pass.field_2._8_8_ != &local_f8) {
        operator_delete((void *)pass.field_2._8_8_,local_f8 + 1);
      }
      if (local_e8 != &local_d8) {
        operator_delete(local_e8,local_d8 + 1);
      }
      if (local_c8 != &local_b8) {
        operator_delete(local_c8,local_b8 + 1);
      }
      if (local_a8 != &__str._M_string_length) {
        operator_delete(local_a8,__str._M_string_length + 1);
      }
      if (*(char *)(uVar9 + 400) == '\0') {
        std::__cxx11::string::append((char *)&local_80);
      }
      if (*(char *)(uVar9 + 0x192) == '\x01') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"|    trying pass command: ",0x1a);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(char *)local_80,
                            (long)currCommand._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      }
      local_1a0._24_8_ = &local_178;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_1a0 + 0x18),local_80,currCommand._M_dataplus._M_p + (long)local_80
                );
      ProgramResult::ProgramResult((ProgramResult *)local_688,(string *)(local_1a0 + 0x18));
      uVar2 = local_688._0_4_;
      if ((undefined1 *)local_688._8_8_ != auStack_670) {
        operator_delete((void *)local_688._8_8_,auStack_670._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._24_8_ != &local_178) {
        operator_delete((void *)local_1a0._24_8_,local_178._M_allocated_capacity + 1);
      }
      if (uVar2 == 0) {
        local_148[0] = local_138;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_148,*(long *)(uVar9 + 0x150),
                   *(long *)(uVar9 + 0x158) + *(long *)(uVar9 + 0x150));
        uVar6 = wasm::file_size(local_148);
        if (local_148[0] != local_138) {
          operator_delete(local_148[0],local_138[0] + 1);
        }
        if (uVar6 < (ulong)__str.field_2._8_8_) {
          local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_168,*(long *)(currCommand.field_2._8_8_ + 0x130),
                     *(long *)(currCommand.field_2._8_8_ + 0x138) +
                     *(long *)(currCommand.field_2._8_8_ + 0x130));
          ProgramResult::ProgramResult((ProgramResult *)local_688,&local_168);
          bVar3 = ProgramResult::operator==((ProgramResult *)local_688,&expected);
          if ((undefined1 *)local_688._8_8_ != auStack_670) {
            operator_delete((void *)local_688._8_8_,auStack_670._0_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168._M_dataplus._M_p != &local_168.field_2) {
            operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
          }
          if (bVar3) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"|    command \"",0xe);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,(char *)local_80,
                                (long)currCommand._M_dataplus._M_p);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5,"\" succeeded, reduced size to ",0x1d);
            poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
            local_688[0] = 10;
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)local_688,1);
            local_34 = (uint)CONCAT71((int7)((ulong)poVar5 >> 8),1);
            applyTestToWorking((Reducer *)currCommand.field_2._8_8_);
            __str.field_2._8_8_ = uVar6;
          }
        }
      }
      if (local_80 != &currCommand._M_string_length) {
        operator_delete(local_80,currCommand._M_string_length + 1);
      }
      uVar9 = currCommand.field_2._8_8_;
      if (local_128 != &pass._M_string_length) {
        operator_delete(local_128,pass._M_string_length + 1);
      }
      auVar11 = (undefined1  [8])((long)auVar11 + 0x20);
    } while (auVar11 != (undefined1  [8])local_1a0._16_8_);
  } while ((local_34 & 1) != 0);
  if (*(char *)(uVar9 + 0x192) == '\x01') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"|    done with passes for now\n",0x1e);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1c8);
  return;
}

Assistant:

void reduceUsingPasses() {
    // run optimization passes until we can't shrink it any more
    std::vector<std::string> passes = {
      // Optimization modes.
      "-Oz",
      "-Os",
      "-O1",
      "-O2",
      "-O3",
      "-O4",
      // Optimization modes + passes that work well with them.
      "--flatten -Os",
      "--flatten -O3",
      "--flatten --simplify-locals-notee-nostructure --local-cse -Os",
      "--type-ssa -Os --type-merging",
      "--gufa -O1",
      // Individual passes or combinations of them.
      "--coalesce-locals --vacuum",
      "--dae",
      "--dae-optimizing",
      "--dce",
      "--duplicate-function-elimination",
      "--enclose-world",
      "--gto",
      "--inlining",
      "--inlining-optimizing",
      "--optimize-level=3 --inlining-optimizing",
      "--local-cse",
      "--memory-packing",
      "--remove-unused-names --merge-blocks --vacuum",
      "--optimize-instructions",
      "--precompute",
      "--remove-imports",
      "--remove-memory-init",
      "--remove-unused-names --remove-unused-brs",
      "--remove-unused-module-elements",
      "--remove-unused-nonfunction-module-elements",
      "--reorder-functions",
      "--reorder-locals",
      // TODO: signature* passes
      "--simplify-globals",
      "--simplify-locals --vacuum",
      "--strip",
      "--remove-unused-types --closed-world",
      "--vacuum"};
    auto oldSize = file_size(working);
    bool more = true;
    while (more) {
      // std::cerr << "|    starting passes loop iteration\n";
      more = false;
      // try both combining with a generic shrink (so minor pass overhead is
      // compensated for), and without
      for (auto pass : passes) {
        std::string currCommand = Path::getBinaryenBinaryTool("wasm-opt") + " ";
        currCommand += working + " -o " + test + " " + pass + " " + extraFlags;
        if (!binary) {
          currCommand += " -S ";
        }
        if (verbose) {
          std::cerr << "|    trying pass command: " << currCommand << "\n";
        }
        if (!ProgramResult(currCommand).failed()) {
          auto newSize = file_size(test);
          if (newSize < oldSize) {
            // the pass didn't fail, and the size looks smaller, so promising
            // see if it is still has the property we are preserving
            if (ProgramResult(command) == expected) {
              std::cerr << "|    command \"" << currCommand
                        << "\" succeeded, reduced size to " << newSize << '\n';
              applyTestToWorking();
              more = true;
              oldSize = newSize;
            }
          }
        }
      }
    }
    if (verbose) {
      std::cerr << "|    done with passes for now\n";
    }
  }